

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O2

void duckdb::PhysicalOrder::ScheduleMergeTasks
               (Pipeline *pipeline,Event *event,OrderGlobalSinkState *state)

{
  shared_ptr<duckdb::OrderMergeEvent,_true> new_event;
  shared_ptr<duckdb::Event,_true> local_38;
  undefined1 local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  GlobalSortState::InitializeMergeRound(&state->global_sort_state);
  make_shared_ptr<duckdb::OrderMergeEvent,duckdb::OrderGlobalSinkState&,duckdb::Pipeline&,duckdb::PhysicalOrder_const&>
            ((OrderGlobalSinkState *)local_28,(Pipeline *)state,(PhysicalOrder *)pipeline);
  local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_28;
  local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Stack_20._M_pi;
  local_28 = (undefined1  [8])0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Event::InsertEvent(event,&local_38);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  return;
}

Assistant:

void PhysicalOrder::ScheduleMergeTasks(Pipeline &pipeline, Event &event, OrderGlobalSinkState &state) {
	// Initialize global sort state for a round of merging
	state.global_sort_state.InitializeMergeRound();
	auto new_event = make_shared_ptr<OrderMergeEvent>(state, pipeline, state.order);
	event.InsertEvent(std::move(new_event));
}